

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

int Spl_ManFindOne(Spl_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  int local_30;
  int local_2c;
  int Res;
  int k;
  int i;
  int iFan;
  int iObj;
  int nFanouts;
  Vec_Int_t *vVec;
  Spl_Man_t *p_local;
  
  Res = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vNodes);
    bVar5 = false;
    if (Res < iVar2) {
      pVVar1 = p->pGia->vMapping2;
      iVar2 = Vec_IntEntry(p->vNodes,Res);
      _iObj = Vec_WecEntry(pVVar1,iVar2);
      bVar5 = _iObj != (Vec_Int_t *)0x0;
    }
    if (!bVar5) break;
    for (local_2c = 0; iVar2 = Vec_IntSize(_iObj), local_2c < iVar2; local_2c = local_2c + 1) {
      iVar2 = Vec_IntEntry(_iObj,local_2c);
      Gia_ObjLutRefDecId(p->pGia,iVar2);
    }
    Res = Res + 1;
  }
  if ((p->fReverse != 0) && (uVar3 = Vec_IntSize(p->vNodes), (uVar3 & 1) != 0)) {
    for (Res = 0; iVar2 = Vec_IntSize(p->vNodes), Res < iVar2; Res = Res + 1) {
      iVar2 = Vec_IntEntry(p->vNodes,Res);
      iVar4 = Gia_ObjLutRefNumId(p->pGia,iVar2);
      if (iVar4 != 0) {
        iVar4 = Gia_ObjLutRefNumId(p->pGia,iVar2);
        if (iVar4 < 1) {
          __assert_fail("Gia_ObjLutRefNumId(p->pGia, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                        ,0x162,"int Spl_ManFindOne(Spl_Man_t *)");
        }
        iVar4 = Gia_ObjLutRefNumId(p->pGia,iVar2);
        if (iVar4 < 5) {
          iVar4 = Spl_ManLutFanouts(p->pGia,iVar2,p->vFanouts,p->vMarksNo,p->vMarksCIO);
          iVar2 = Gia_ObjLutRefNumId(p->pGia,iVar2);
          if ((iVar2 == 1) && (iVar4 == 1)) {
            local_30 = Vec_IntEntry(p->vFanouts,0);
            goto LAB_00a1daf8;
          }
        }
      }
    }
  }
  Vec_IntClear(p->vCands);
  Vec_IntClear(p->vInputs);
  Res = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vNodes);
    bVar5 = false;
    if (Res < iVar2) {
      pVVar1 = p->pGia->vMapping2;
      iVar2 = Vec_IntEntry(p->vNodes,Res);
      _iObj = Vec_WecEntry(pVVar1,iVar2);
      bVar5 = _iObj != (Vec_Int_t *)0x0;
    }
    if (!bVar5) break;
    for (local_2c = 0; iVar2 = Vec_IntSize(_iObj), local_2c < iVar2; local_2c = local_2c + 1) {
      iVar2 = Vec_IntEntry(_iObj,local_2c);
      iVar4 = Vec_BitEntry(p->vMarksNo,iVar2);
      if (((iVar4 == 0) && (iVar4 = Vec_BitEntry(p->vMarksCIO,iVar2), iVar4 == 0)) &&
         (iVar4 = Gia_ObjLutRefNumId(p->pGia,iVar2), iVar4 == 0)) {
        Vec_IntPush(p->vCands,iVar2);
        Vec_IntPush(p->vInputs,iVar2);
      }
    }
    Res = Res + 1;
  }
  local_30 = Spl_ManFindGoodCand(p);
  if (local_30 == 0) {
    Vec_IntClear(p->vCands);
    Vec_IntClear(p->vInputs);
    Res = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p->vNodes);
      bVar5 = false;
      if (Res < iVar2) {
        pVVar1 = p->pGia->vMapping2;
        iVar2 = Vec_IntEntry(p->vNodes,Res);
        _iObj = Vec_WecEntry(pVVar1,iVar2);
        bVar5 = _iObj != (Vec_Int_t *)0x0;
      }
      if (!bVar5) break;
      for (local_2c = 0; iVar2 = Vec_IntSize(_iObj), local_2c < iVar2; local_2c = local_2c + 1) {
        iVar2 = Vec_IntEntry(_iObj,local_2c);
        iVar4 = Vec_BitEntry(p->vMarksNo,iVar2);
        if ((iVar4 == 0) && (iVar4 = Vec_BitEntry(p->vMarksCIO,iVar2), iVar4 == 0)) {
          Vec_IntPush(p->vCands,iVar2);
          Vec_IntPush(p->vInputs,iVar2);
        }
      }
      Res = Res + 1;
    }
    for (Res = 0; iVar2 = Vec_IntSize(p->vNodes), Res < iVar2; Res = Res + 1) {
      iVar2 = Vec_IntEntry(p->vNodes,Res);
      iVar4 = Gia_ObjLutRefNumId(p->pGia,iVar2);
      if (iVar4 != 0) {
        iVar4 = Gia_ObjLutRefNumId(p->pGia,iVar2);
        if (iVar4 < 1) {
          __assert_fail("Gia_ObjLutRefNumId(p->pGia, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                        ,0x18d,"int Spl_ManFindOne(Spl_Man_t *)");
        }
        iVar4 = Gia_ObjLutRefNumId(p->pGia,iVar2);
        if (iVar4 < 5) {
          iVar4 = Spl_ManLutFanouts(p->pGia,iVar2,p->vFanouts,p->vMarksNo,p->vMarksCIO);
          iVar2 = Gia_ObjLutRefNumId(p->pGia,iVar2);
          if ((iVar2 == 1) && (iVar4 == 1)) {
            local_30 = Vec_IntEntry(p->vFanouts,0);
            goto LAB_00a1daf8;
          }
          Vec_IntAppend(p->vCands,p->vFanouts);
        }
      }
    }
    local_30 = Spl_ManFindGoodCand(p);
    if ((local_30 == 0) && (iVar2 = Vec_IntSize(p->vCands), 0 < iVar2)) {
      local_30 = Vec_IntEntry(p->vCands,0);
    }
  }
LAB_00a1daf8:
  Res = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vNodes);
    bVar5 = false;
    if (Res < iVar2) {
      pVVar1 = p->pGia->vMapping2;
      iVar2 = Vec_IntEntry(p->vNodes,Res);
      _iObj = Vec_WecEntry(pVVar1,iVar2);
      bVar5 = _iObj != (Vec_Int_t *)0x0;
    }
    if (!bVar5) break;
    for (local_2c = 0; iVar2 = Vec_IntSize(_iObj), local_2c < iVar2; local_2c = local_2c + 1) {
      iVar2 = Vec_IntEntry(_iObj,local_2c);
      Gia_ObjLutRefIncId(p->pGia,iVar2);
    }
    Res = Res + 1;
  }
  return local_30;
}

Assistant:

int Spl_ManFindOne( Spl_Man_t * p )
{
    Vec_Int_t * vVec;
    int nFanouts, iObj, iFan, i, k;
    int Res = 0; 

    // deref
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefDecId( p->pGia, iFan );

    // collect external nodes
    if ( p->fReverse && (Vec_IntSize(p->vNodes) & 1) )
    {
        Vec_IntForEachEntry( p->vNodes, iObj, i )
        {
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 0 )
                continue;
            assert( Gia_ObjLutRefNumId(p->pGia, iObj) > 0 );
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) >= 5 )  // skip nodes with high fanout!
                continue;
            nFanouts = Spl_ManLutFanouts( p->pGia, iObj, p->vFanouts, p->vMarksNo, p->vMarksCIO );
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 1 && nFanouts == 1 )
            {
                Res = Vec_IntEntry(p->vFanouts, 0);
                goto finish;
            }
            //Vec_IntAppend( p->vCands, p->vFanouts );
        }
    }

    // consider LUT inputs - get one that has no refs
    Vec_IntClear( p->vCands );
    Vec_IntClear( p->vInputs );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) && !Vec_BitEntry(p->vMarksCIO, iFan) && !Gia_ObjLutRefNumId(p->pGia, iFan) )
            {
                Vec_IntPush( p->vCands, iFan );
                Vec_IntPush( p->vInputs, iFan );
            }
    Res = Spl_ManFindGoodCand( p );
    if ( Res )
        goto finish;

    // collect candidates
    Vec_IntClear( p->vCands );
    Vec_IntClear( p->vInputs );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) && !Vec_BitEntry(p->vMarksCIO, iFan) )
            {
                Vec_IntPush( p->vCands, iFan );
                Vec_IntPush( p->vInputs, iFan );
            }

    // all inputs have refs - collect external nodes
    Vec_IntForEachEntry( p->vNodes, iObj, i )
    {
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 0 )
            continue;
        assert( Gia_ObjLutRefNumId(p->pGia, iObj) > 0 );
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) >= 5 )  // skip nodes with high fanout!
            continue;
        nFanouts = Spl_ManLutFanouts( p->pGia, iObj, p->vFanouts, p->vMarksNo, p->vMarksCIO );
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 1 && nFanouts == 1 )
        {
            Res = Vec_IntEntry(p->vFanouts, 0);
            goto finish;
        }
        Vec_IntAppend( p->vCands, p->vFanouts );
    }

    // choose among not-so-good ones
    Res = Spl_ManFindGoodCand( p );
    if ( Res )
        goto finish;

    // get the first candidate
    if ( Res == 0 && Vec_IntSize(p->vCands) > 0 )
        Res = Vec_IntEntry( p->vCands, 0 );

finish:
    // ref
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefIncId( p->pGia, iFan );
    return Res;
}